

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O0

void update_ssg_eg_channel(FM_SLOT *SLOT)

{
  UINT8 UVar1;
  int local_14;
  FM_SLOT *pFStack_10;
  uint i;
  FM_SLOT *SLOT_local;
  
  local_14 = 4;
  pFStack_10 = SLOT;
  do {
    if ((((pFStack_10->ssg & 8) != 0) && (0x1ff < pFStack_10->volume)) && (1 < pFStack_10->state)) {
      if ((pFStack_10->ssg & 1) == 0) {
        if ((pFStack_10->ssg & 2) == 0) {
          pFStack_10->phase = 0;
        }
        else {
          pFStack_10->ssgn = pFStack_10->ssgn ^ 4;
        }
        if (pFStack_10->state != '\x04') {
          if (pFStack_10->ar + (uint)pFStack_10->ksr < 0x5e) {
            if (pFStack_10->volume < 1) {
              UVar1 = '\x03';
              if (pFStack_10->sl == 0) {
                UVar1 = '\x02';
              }
            }
            else {
              UVar1 = '\x04';
            }
            pFStack_10->state = UVar1;
          }
          else {
            pFStack_10->volume = 0;
            UVar1 = '\x03';
            if (pFStack_10->sl == 0) {
              UVar1 = '\x02';
            }
            pFStack_10->state = UVar1;
          }
        }
      }
      else {
        if ((pFStack_10->ssg & 2) != 0) {
          pFStack_10->ssgn = '\x04';
        }
        if ((pFStack_10->state != '\x04') && (pFStack_10->ssgn == (pFStack_10->ssg & 4))) {
          pFStack_10->volume = 0x3ff;
        }
      }
      if (pFStack_10->ssgn == (pFStack_10->ssg & 4)) {
        pFStack_10->vol_out = pFStack_10->volume + pFStack_10->tl;
      }
      else {
        pFStack_10->vol_out = (0x200U - pFStack_10->volume & 0x3ff) + pFStack_10->tl;
      }
    }
    pFStack_10 = pFStack_10 + 1;
    local_14 = local_14 + -1;
  } while (local_14 != 0);
  return;
}

Assistant:

INLINE void update_ssg_eg_channel(FM_SLOT *SLOT)
{
	unsigned int i = 4; /* four operators per channel */

	do
	{
		/* detect SSG-EG transition */
		/* this is not required during release phase as the attenuation has been forced to MAX and output invert flag is not used */
		/* if an Attack Phase is programmed, inversion can occur on each sample */
		if ((SLOT->ssg & 0x08) && (SLOT->volume >= 0x200) && (SLOT->state > EG_REL))
		{
			if (SLOT->ssg & 0x01)  /* bit 0 = hold SSG-EG */
			{
				/* set inversion flag */
				if (SLOT->ssg & 0x02)
					SLOT->ssgn = 4;

				/* force attenuation level during decay phases */
				if ((SLOT->state != EG_ATT) && !(SLOT->ssgn ^ (SLOT->ssg & 0x04)))
					SLOT->volume  = MAX_ATT_INDEX;
			}
			else  /* loop SSG-EG */
			{
				/* toggle output inversion flag or reset Phase Generator */
					if (SLOT->ssg & 0x02)
						SLOT->ssgn ^= 4;
					else
						SLOT->phase = 0;

				/* same as Key ON */
				if (SLOT->state != EG_ATT)
				{
					if ((SLOT->ar + SLOT->ksr) < 94 /*32+62*/)
					{
						SLOT->state = (SLOT->volume <= MIN_ATT_INDEX) ? ((SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC) : EG_ATT;
					}
					else
					{
						/* Attack Rate is maximal: directly switch to Decay or Substain */
						SLOT->volume = MIN_ATT_INDEX;
						SLOT->state = (SLOT->sl == MIN_ATT_INDEX) ? EG_SUS : EG_DEC;
					}
				}
			}

			/* recalculate EG output */
			if (SLOT->ssgn ^ (SLOT->ssg&0x04))
				SLOT->vol_out = ((UINT32)(0x200 - SLOT->volume) & MAX_ATT_INDEX) + SLOT->tl;
			else
				SLOT->vol_out = (UINT32)SLOT->volume + SLOT->tl;
		}

		/* next slot */
		SLOT++;
		i--;
	} while (i);
}